

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_string.cpp
# Opt level: O2

raw_sstring_view
pstore::get_unique_sstring_view
          (database *db,address addr,size_t length,
          not_null<pstore::sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>_*>
          owner)

{
  uint uVar1;
  ulong uVar2;
  raw_sstring_view rVar3;
  undefined1 local_48 [24];
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Stack_30;
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  local_28;
  
  uVar1 = varint::encoded_size(length);
  uVar2 = 2;
  if (2 < uVar1) {
    uVar2 = (ulong)uVar1;
  }
  database::getrou<char,void>((database *)local_48,(typed_address<char>)db,uVar2 + addr.a_);
  local_48._16_8_ = local_48._0_8_;
  _Stack_30._M_head_impl = (array<pstore::sat_entry,_65536UL> *)local_48._8_8_;
  local_48._8_8_ =
       (__uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )0x0;
  local_28._M_t.
  super___uniq_ptr_impl<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::system_page_size_interface_*,_std::default_delete<pstore::system_page_size_interface>_>
  .super__Head_base<0UL,_pstore::system_page_size_interface_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>,_true,_true>
        )(__uniq_ptr_data<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>,_true,_true>
          )length;
  sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_>::operator=
            (owner.ptr_,
             (sstring_view<std::unique_ptr<const_char,_void_(*)(const_char_*)>_> *)(local_48 + 0x10)
            );
  std::unique_ptr<const_char,_void_(*)(const_char_*)>::~unique_ptr
            ((unique_ptr<const_char,_void_(*)(const_char_*)> *)(local_48 + 0x10));
  std::unique_ptr<const_char,_void_(*)(const_char_*)>::~unique_ptr
            ((unique_ptr<const_char,_void_(*)(const_char_*)> *)local_48);
  rVar3.size_ = length;
  rVar3.ptr_ = ((owner.ptr_)->ptr_)._M_t.super___uniq_ptr_impl<const_char,_void_(*)(const_char_*)>.
               _M_t.super__Tuple_impl<0UL,_const_char_*,_void_(*)(const_char_*)>.
               super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
  return rVar3;
}

Assistant:

raw_sstring_view
    get_unique_sstring_view (database const & db, address const addr, std::size_t const length,
                             gsl::not_null<unique_pointer_sstring_view *> const owner) {
        *owner = unique_pointer_sstring_view{
            db.getrou (
                typed_address<char>::make (addr + std::max (varint::encoded_size (length), 2U)),
                length),
            length};
        return {owner->data (), length};
    }